

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFlushFinishTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_0::FlushFinishCase::iterate(FlushFinishCase *this)

{
  undefined8 *puVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  float fVar4;
  ExpectedBehavior EVar5;
  TestLog *pTVar6;
  qpWatchDog *dog;
  LineParameters LVar7;
  LineParameters LVar8;
  int iVar9;
  int *piVar10;
  pointer __src;
  pointer pSVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  deUint32 dVar15;
  undefined4 extraout_var;
  RenderTarget *pRVar16;
  undefined4 extraout_var_00;
  deUint64 dVar17;
  undefined4 extraout_var_01;
  deUint64 dVar18;
  undefined4 extraout_var_02;
  deUint64 dVar19;
  int *__dest;
  size_t sVar20;
  TestError *this_00;
  runtime_error *this_01;
  int iVar21;
  long lVar22;
  char *pcVar23;
  deUint64 *pdVar24;
  int *piVar25;
  char *__s;
  ulong uVar26;
  uint numDrawCalls;
  uint uVar27;
  __normal_iterator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample_*,_std::vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>_>
  __i;
  bool bVar28;
  float fVar29;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar30;
  vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  samples;
  deUint8 tmp_2 [4];
  ScopedLogSection section;
  size_type __dnew;
  deUint8 tmp [4];
  size_type __dnew_6;
  size_type __dnew_1;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> readTimes;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> waitTimes;
  size_type __dnew_7;
  ulong local_508;
  uint local_4f8;
  float fStack_4f4;
  vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  local_4d8;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  ulong local_4a0;
  LogNumber<float> local_498;
  string local_430;
  string local_410;
  string local_3f0;
  LogNumber<float> local_3d0;
  string local_368;
  string local_348;
  undefined1 local_328 [8];
  undefined1 auStack_320 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  _Alloc_hider local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  _Alloc_hider local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  qpKeyValueTag local_2c8;
  float local_2c4;
  deInt64 local_2c0;
  ios_base local_2b0 [264];
  string local_1a8;
  LogNumber<float> local_188;
  string local_120;
  string local_100;
  string local_e0;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_c0;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  local_4d8.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d8.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4d8.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(600);
  local_4d8.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_4d8.
       super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
       ._M_impl.super__Vector_impl_data._M_start + 0x19;
  *(undefined8 *)
   local_4d8.
   super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
   ._M_impl.super__Vector_impl_data._M_start = 0;
  (local_4d8.
   super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
   ._M_impl.super__Vector_impl_data._M_start)->waitTime = 0;
  (local_4d8.
   super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
   ._M_impl.super__Vector_impl_data._M_start)->readPixelsTime = 0;
  lVar22 = 0x18;
  do {
    *(deUint64 *)
     ((long)&(local_4d8.
              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start)->readPixelsTime + lVar22) =
         (local_4d8.
          super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start)->readPixelsTime;
    dVar17 = (local_4d8.
              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start)->waitTime;
    puVar1 = (undefined8 *)
             ((long)&(local_4d8.
                      super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start)->numDrawCalls + lVar22);
    *puVar1 = *(undefined8 *)
               local_4d8.
               super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
    puVar1[1] = dVar17;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 600);
  local_4d8.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_4d8.
       super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  tcu::warmupCPU();
  iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar22 = CONCAT44(extraout_var,iVar13);
  iVar14 = (**(code **)(lVar22 + 0x780))((this->m_program->m_program).m_program);
  pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar13 = pRVar16->m_width;
  pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (iVar14 < 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"posLoc >= 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fFlushFinishTests.cpp"
               ,0xe9);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar21 = pRVar16->m_height;
  if (0x7f < iVar21) {
    iVar21 = 0x80;
  }
  iVar9 = 0x80;
  if (iVar13 < 0x80) {
    iVar9 = iVar13;
  }
  (**(code **)(lVar22 + 0x1a00))(0,0,iVar9,iVar21);
  (**(code **)(lVar22 + 0x1680))((this->m_program->m_program).m_program);
  (**(code **)(lVar22 + 0x610))(iVar14);
  (**(code **)(lVar22 + 0x19f0))
            (iVar14,2,0x1406,0,0,
             Functional::(anonymous_namespace)::FlushFinishCase::setupRenderState()::s_positions);
  (**(code **)(lVar22 + 0x5e0))(0xbe2);
  (**(code **)(lVar22 + 0x120))(1,1);
  (**(code **)(lVar22 + 0x100))(0x8006);
  dVar15 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar15,"Failed to set up render state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fFlushFinishTests.cpp"
                  ,0xf2);
  render(this,1);
  iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar13) + 0x1220))(0,0,1,1,0x1908,0x1401,local_328);
  pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_328 = (undefined1  [8])(auStack_320 + 8);
  local_318._M_allocated_capacity._0_4_ = 0x696c6143;
  local_318._M_allocated_capacity._4_4_ = 0x74617262;
  local_318._8_7_ = 0x6f666e496e6f69;
  auStack_320 = (undefined1  [8])0xf;
  local_318._M_local_buf[0xf] = '\0';
  local_498.m_name._M_dataplus._M_p = (pointer)&local_498.m_name.field_2;
  local_3d0.m_name._M_dataplus._M_p = (pointer)0x10;
  local_498.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_498,(ulong)&local_3d0);
  local_498.m_name.field_2._M_allocated_capacity = (size_type)local_3d0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_498.m_name._M_dataplus._M_p,"Calibration info",0x10);
  local_498.m_name._M_string_length = (size_type)local_3d0.m_name._M_dataplus._M_p;
  local_498.m_name._M_dataplus._M_p[(long)local_3d0.m_name._M_dataplus._M_p] = '\0';
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_3f0,pTVar6,(string *)local_328,&local_498.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498.m_name._M_dataplus._M_p != &local_498.m_name.field_2) {
    operator_delete(local_498.m_name._M_dataplus._M_p,
                    (ulong)(local_498.m_name.field_2._M_allocated_capacity + 1));
  }
  if (local_328 != (undefined1  [8])(auStack_320 + 8)) {
    operator_delete((void *)local_328,
                    CONCAT44(local_318._M_allocated_capacity._4_4_,
                             local_318._M_allocated_capacity._0_4_) + 1);
  }
  local_328 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_320);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_320,"Calibrating maximum draw call count, target duration = ",0x37);
  std::ostream::operator<<((ostringstream *)auStack_320,1000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_320," us",3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_320);
  std::ios_base::~ios_base(local_2b0);
  numDrawCalls = 1;
  local_508 = 0;
  local_4f8 = 1;
  do {
    dVar17 = deGetMicroseconds();
    render(this,numDrawCalls);
    iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_01,iVar13) + 0x1220))
              (0,0,1,1,0x1908,0x1401,(MessageBuilder *)local_328);
    dVar18 = deGetMicroseconds();
    local_328 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_320);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_320,"Duration with ",0xe);
    std::ostream::operator<<((ostringstream *)auStack_320,numDrawCalls);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_320," draw calls = ",0xe);
    uVar26 = dVar18 - dVar17;
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_320);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_320," us",3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_320);
    std::ios_base::~ios_base(local_2b0);
    if (uVar26 < 0xf4241) {
      if (0xfffff < (int)numDrawCalls) goto LAB_00fe985a;
      bVar12 = true;
      uVar27 = numDrawCalls * 2;
      local_508 = uVar26;
      local_4f8 = numDrawCalls;
    }
    else if ((int)numDrawCalls < 2) {
LAB_00fe985a:
      bVar12 = false;
      uVar27 = numDrawCalls;
    }
    else {
      fVar30 = (float)(uVar26 - local_508) / (float)(int)(numDrawCalls - local_4f8);
      fVar30 = floorf((1e+06 - ((float)(long)local_508 - (float)(int)local_4f8 * fVar30)) / fVar30);
      uVar27 = (uint)fVar30;
      if (0xfffff < (int)uVar27) {
        uVar27 = 0x100000;
      }
      if ((int)uVar27 < 2) {
        uVar27 = 1;
      }
      bVar12 = false;
    }
    numDrawCalls = uVar27;
    if (!bVar12) {
      pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_498.m_name._M_dataplus._M_p = (pointer)&local_498.m_name.field_2;
      local_498.m_name.field_2._M_allocated_capacity = 0x437761724478614d;
      local_498.m_name.field_2._8_4_ = 0x736c6c61;
      local_498.m_name._M_string_length = 0xc;
      local_498.m_name.field_2._M_local_buf[0xc] = '\0';
      local_3d0.m_name._M_dataplus._M_p = (pointer)&local_3d0.m_name.field_2;
      local_188.m_name._M_dataplus._M_p = (pointer)0x1c;
      local_3d0.m_name._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_3d0,(ulong)&local_188);
      local_3d0.m_name.field_2._M_allocated_capacity = (size_type)local_188.m_name._M_dataplus._M_p;
      builtin_strncpy((char *)((long)((long)local_3d0.m_name._M_dataplus._M_p + 8) + 4),"er of dr",8
                     );
      builtin_strncpy((char *)((long)((long)local_3d0.m_name._M_dataplus._M_p + 0x10) + 4),
                      "aw calls",8);
      *(undefined8 *)local_3d0.m_name._M_dataplus._M_p = 0x206d756d6978614d;
      *(undefined8 *)((long)local_3d0.m_name._M_dataplus._M_p + 8) = 0x6f207265626d756e;
      local_3d0.m_name._M_string_length = (size_type)local_188.m_name._M_dataplus._M_p;
      local_188.m_name._M_dataplus._M_p[(long)local_3d0.m_name._M_dataplus._M_p] = '\0';
      local_188.m_name._M_string_length = 0;
      local_188.m_name.field_2._M_local_buf[0] = '\0';
      local_188.m_name._M_dataplus._M_p = (pointer)&local_188.m_name.field_2;
      tcu::LogNumber<long>::LogNumber
                ((LogNumber<long> *)local_328,&local_498.m_name,&local_3d0.m_name,&local_188.m_name,
                 QP_KEY_TAG_NONE,(long)(int)numDrawCalls);
      tcu::TestLog::writeInteger
                (pTVar6,(char *)local_328,local_308._M_p,local_2e8._M_p,local_2c8,local_2c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_p != &local_2d8) {
        operator_delete(local_2e8._M_p,local_2d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_p != &local_2f8) {
        operator_delete(local_308._M_p,local_2f8._M_allocated_capacity + 1);
      }
      if (local_328 != (undefined1  [8])(auStack_320 + 8)) {
        operator_delete((void *)local_328,
                        CONCAT44(local_318._M_allocated_capacity._4_4_,
                                 local_318._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.m_name._M_dataplus._M_p != &local_188.m_name.field_2) {
        operator_delete(local_188.m_name._M_dataplus._M_p,
                        CONCAT71(local_188.m_name.field_2._M_allocated_capacity._1_7_,
                                 local_188.m_name.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0.m_name._M_dataplus._M_p != &local_3d0.m_name.field_2) {
        operator_delete(local_3d0.m_name._M_dataplus._M_p,
                        local_3d0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498.m_name._M_dataplus._M_p != &local_498.m_name.field_2) {
        operator_delete(local_498.m_name._M_dataplus._M_p,
                        local_498.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((int)numDrawCalls < 10) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_328 = (undefined1  [8])(auStack_320 + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_328,"Calibration failed, maximum draw call count is too low","");
        std::runtime_error::runtime_error(this_01,(string *)local_328);
        *(undefined ***)this_01 = &PTR__runtime_error_02179050;
        __cxa_throw(this_01,&Functional::(anonymous_namespace)::CalibrationFailedException::typeinfo
                    ,std::runtime_error::~runtime_error);
      }
      tcu::TestLog::endSection((TestLog *)local_3f0._M_dataplus._M_p);
      deRandom_init((deRandom *)local_328,0x7b);
      pSVar11 = local_4d8.
                super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      __src = local_4d8.
              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start;
      local_4a0 = ((long)local_4d8.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_4d8.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      uVar26 = (long)local_4d8.
                     super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_4d8.
                     super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if (uVar26 != 0) {
        lVar22 = local_4a0 + (local_4a0 == 0);
        pdVar24 = &(local_4d8.
                    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start)->readPixelsTime;
        do {
          dVar15 = deRandom_getUint32((deRandom *)local_328);
          iVar14 = dVar15 % numDrawCalls + 1;
          render(this,iVar14);
          dVar17 = deGetMicroseconds();
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
          dVar18 = deGetMicroseconds();
          iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
          (**(code **)(CONCAT44(extraout_var_02,iVar13) + 0x1220))(0,0,1,1,0x1908,0x1401,&local_498)
          ;
          dVar19 = deGetMicroseconds();
          ((Sample *)(pdVar24 + -2))->numDrawCalls = iVar14;
          pdVar24[-1] = dVar18 - dVar17;
          *pdVar24 = dVar19 - dVar18;
          dog = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_watchDog;
          if (dog != (qpWatchDog *)0x0) {
            qpWatchDog_touch(dog);
          }
          pdVar24 = pdVar24 + 3;
          lVar22 = lVar22 + -1;
        } while (lVar22 != 0);
      }
      getPointsFromSamples(&local_a8,&local_4d8,8);
      getPointsFromSamples(&local_c0,&local_4d8,0x10);
      LVar7 = deqp::gls::theilSenLinearRegression(&local_a8);
      LVar8 = deqp::gls::theilSenLinearRegression(&local_c0);
      fStack_4b0 = (float)extraout_XMM0_Dc;
      local_4b8._0_4_ = LVar8.offset;
      local_4b8._4_4_ = LVar8.coefficient;
      fStack_4ac = (float)extraout_XMM0_Dd;
      local_328 = (undefined1  [8])(auStack_320 + 8);
      local_318._M_allocated_capacity._0_4_ = 0x706d6153;
      auStack_320 = (undefined1  [8])0x7;
      local_318._M_allocated_capacity._4_4_ = 0x73656c;
      paVar3 = &local_498.m_name.field_2;
      local_498.m_name._M_string_length = 7;
      local_498.m_name.field_2._M_allocated_capacity = 0x73656c706d6153;
      local_498.m_name._M_dataplus._M_p = (pointer)paVar3;
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)&local_3d0,
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                 (string *)local_328,&local_498.m_name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498.m_name._M_dataplus._M_p != paVar3) {
        operator_delete(local_498.m_name._M_dataplus._M_p,
                        local_498.m_name.field_2._M_allocated_capacity + 1);
      }
      if (local_328 != (undefined1  [8])(auStack_320 + 8)) {
        operator_delete((void *)local_328,
                        CONCAT44(local_318._M_allocated_capacity._4_4_,
                                 local_318._M_allocated_capacity._0_4_) + 1);
      }
      if (0x555555555555555 < local_4a0) {
        std::__throw_length_error("cannot create std::vector larger than max_size()");
      }
      if (pSVar11 == __src) {
        __dest = (int *)0x0;
      }
      else {
        __dest = (int *)operator_new(uVar26);
        memcpy(__dest,__src,uVar26);
        piVar2 = (int *)((long)__dest + uVar26);
        lVar22 = 0x3f;
        if (local_4a0 != 0) {
          for (; local_4a0 >> lVar22 == 0; lVar22 = lVar22 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles2::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
                  (__dest,piVar2,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)uVar26 < 0x181) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles2::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
                    (__dest,piVar2);
        }
        else {
          piVar25 = __dest + 0x60;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles2::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
                    (__dest,piVar25);
          do {
            iVar14 = *piVar25;
            local_318._M_allocated_capacity._0_4_ = piVar25[5];
            local_328 = *(undefined1 (*) [8])(piVar25 + 1);
            auStack_320 = *(undefined1 (*) [8])(piVar25 + 3);
            iVar13 = piVar25[-6];
            piVar10 = piVar25;
            while (iVar14 < iVar13) {
              *(undefined8 *)(piVar10 + 4) = *(undefined8 *)(piVar10 + -2);
              *(undefined8 *)piVar10 = *(undefined8 *)(piVar10 + -6);
              *(undefined8 *)(piVar10 + 2) = *(undefined8 *)(piVar10 + -4);
              iVar13 = piVar10[-0xc];
              piVar10 = piVar10 + -6;
            }
            *piVar10 = iVar14;
            *(undefined1 (*) [8])(piVar10 + 1) = local_328;
            *(undefined1 (*) [8])(piVar10 + 3) = auStack_320;
            piVar10[5] = local_318._M_allocated_capacity._0_4_;
            piVar25 = piVar25 + 6;
          } while (piVar25 != piVar2);
        }
        if (pSVar11 != __src) {
          piVar25 = __dest;
          do {
            local_328 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_320);
            std::ostream::operator<<((ostringstream *)auStack_320,*piVar25);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_320," calls:\t",8)
            ;
            std::ostream::_M_insert<unsigned_long>((ulong)auStack_320);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_320," us wait,\t",10);
            std::ostream::_M_insert<unsigned_long>((ulong)auStack_320);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_320," us read",8);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_320);
            std::ios_base::~ios_base(local_2b0);
            piVar25 = piVar25 + 6;
          } while (piVar25 != piVar2);
        }
      }
      if (__dest != (int *)0x0) {
        operator_delete(__dest,uVar26);
      }
      tcu::TestLog::endSection((TestLog *)local_3d0.m_name._M_dataplus._M_p);
      pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
      local_3f0.field_2._M_allocated_capacity._0_7_ = 0x656f4374696157;
      local_3f0.field_2._M_local_buf[7] = 'f';
      local_3f0.field_2._8_7_ = 0x746e6569636966;
      local_3f0._M_string_length = 0xf;
      local_3f0.field_2._M_local_buf[0xf] = '\0';
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      local_498.m_name._M_dataplus._M_p = (char *)0x10;
      local_348._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_348,(ulong)&local_498);
      fStack_4f4 = LVar7.coefficient;
      local_348.field_2._M_allocated_capacity = (size_type)local_498.m_name._M_dataplus._M_p;
      builtin_strncpy(local_348._M_dataplus._M_p,"Wait coefficient",0x10);
      local_348._M_string_length = (size_type)local_498.m_name._M_dataplus._M_p;
      local_348._M_dataplus._M_p[(long)local_498.m_name._M_dataplus._M_p] = '\0';
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      local_e0._M_string_length = 0;
      local_e0.field_2._M_local_buf[0] = '\0';
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_328,&local_3f0,&local_348,&local_e0,QP_KEY_TAG_NONE,
                 fStack_4f4);
      tcu::TestLog::writeFloat
                (pTVar6,(char *)local_328,local_308._M_p,local_2e8._M_p,local_2c8,local_2c4);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      local_100.field_2._M_allocated_capacity._0_7_ = 0x656f4364616552;
      local_100.field_2._M_local_buf[7] = 'f';
      local_100.field_2._8_7_ = 0x746e6569636966;
      local_100._M_string_length = 0xf;
      local_100.field_2._M_local_buf[0xf] = '\0';
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      local_3d0.m_name._M_dataplus._M_p = (pointer)0x10;
      local_368._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_368,(ulong)&local_3d0);
      local_368.field_2._M_allocated_capacity = (size_type)local_3d0.m_name._M_dataplus._M_p;
      builtin_strncpy(local_368._M_dataplus._M_p,"Read coefficient",0x10);
      local_368._M_string_length = (size_type)local_3d0.m_name._M_dataplus._M_p;
      local_368._M_dataplus._M_p[(long)local_3d0.m_name._M_dataplus._M_p] = '\0';
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      local_120._M_string_length = 0;
      local_120.field_2._M_local_buf[0] = '\0';
      local_4b8._0_4_ = local_4b8._4_4_;
      fStack_4b0 = (float)local_4b8._4_4_;
      fStack_4ac = (float)local_4b8._4_4_;
      tcu::LogNumber<float>::LogNumber
                (&local_498,&local_100,&local_368,&local_120,QP_KEY_TAG_NONE,(float)local_4b8._4_4_)
      ;
      tcu::TestLog::writeFloat
                (pTVar6,local_498.m_name._M_dataplus._M_p,local_498.m_desc._M_dataplus._M_p,
                 local_498.m_unit._M_dataplus._M_p,local_498.m_tag,local_498.m_value);
      local_188.m_name._M_dataplus._M_p = (pointer)0x19;
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      local_410._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_410,(ulong)&local_188);
      local_410.field_2._M_allocated_capacity = (size_type)local_188.m_name._M_dataplus._M_p;
      builtin_strncpy(local_410._M_dataplus._M_p,"NormalizedWaitCoefficient",0x19);
      local_410._M_string_length = (size_type)local_188.m_name._M_dataplus._M_p;
      local_410._M_dataplus._M_p[(long)local_188.m_name._M_dataplus._M_p] = '\0';
      local_188.m_name._M_dataplus._M_p = (char *)0x1b;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_188);
      fVar30 = (fStack_4f4 * (float)(int)numDrawCalls) / 1e+06;
      local_70.field_2._M_allocated_capacity = (size_type)local_188.m_name._M_dataplus._M_p;
      builtin_strncpy(local_70._M_dataplus._M_p,"Normalized wait coefficient",0x1b);
      local_70._M_string_length = (size_type)local_188.m_name._M_dataplus._M_p;
      local_70._M_dataplus._M_p[(long)local_188.m_name._M_dataplus._M_p] = '\0';
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      tcu::LogNumber<float>::LogNumber
                (&local_3d0,&local_410,&local_70,&local_50,QP_KEY_TAG_NONE,fVar30);
      tcu::TestLog::writeFloat
                (pTVar6,local_3d0.m_name._M_dataplus._M_p,local_3d0.m_desc._M_dataplus._M_p,
                 local_3d0.m_unit._M_dataplus._M_p,local_3d0.m_tag,local_3d0.m_value);
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      local_1a8._M_dataplus._M_p = (pointer)0x19;
      local_430._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_430,(ulong)&local_1a8);
      local_430.field_2._M_allocated_capacity = (size_type)local_1a8._M_dataplus._M_p;
      builtin_strncpy(local_430._M_dataplus._M_p,"NormalizedReadCoefficient",0x19);
      local_430._M_string_length = (size_type)local_1a8._M_dataplus._M_p;
      local_430._M_dataplus._M_p[(long)local_1a8._M_dataplus._M_p] = '\0';
      local_90._M_dataplus._M_p = (pointer)0x1b;
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      local_1a8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_1a8,(ulong)&local_90);
      local_4b8._0_4_ = ((float)local_4b8._0_4_ * (float)(int)numDrawCalls) / 1e+06;
      local_1a8.field_2._M_allocated_capacity = (size_type)local_90._M_dataplus._M_p;
      builtin_strncpy(local_1a8._M_dataplus._M_p,"Normalized read coefficient",0x1b);
      local_1a8._M_string_length = (size_type)local_90._M_dataplus._M_p;
      local_1a8._M_dataplus._M_p[(long)local_90._M_dataplus._M_p] = '\0';
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      tcu::LogNumber<float>::LogNumber
                (&local_188,&local_430,&local_1a8,&local_90,QP_KEY_TAG_NONE,(float)local_4b8._0_4_);
      tcu::TestLog::writeFloat
                (pTVar6,local_188.m_name._M_dataplus._M_p,local_188.m_desc._M_dataplus._M_p,
                 local_188.m_unit._M_dataplus._M_p,local_188.m_tag,local_188.m_value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.m_unit._M_dataplus._M_p != &local_188.m_unit.field_2) {
        operator_delete(local_188.m_unit._M_dataplus._M_p,
                        local_188.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.m_desc._M_dataplus._M_p != &local_188.m_desc.field_2) {
        operator_delete(local_188.m_desc._M_dataplus._M_p,
                        local_188.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.m_name._M_dataplus._M_p != &local_188.m_name.field_2) {
        operator_delete(local_188.m_name._M_dataplus._M_p,
                        CONCAT71(local_188.m_name.field_2._M_allocated_capacity._1_7_,
                                 local_188.m_name.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,
                        (ulong)(local_430.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0.m_unit._M_dataplus._M_p != &local_3d0.m_unit.field_2) {
        operator_delete(local_3d0.m_unit._M_dataplus._M_p,
                        local_3d0.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0.m_desc._M_dataplus._M_p != &local_3d0.m_desc.field_2) {
        operator_delete(local_3d0.m_desc._M_dataplus._M_p,
                        local_3d0.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0.m_name._M_dataplus._M_p != &local_3d0.m_name.field_2) {
        operator_delete(local_3d0.m_name._M_dataplus._M_p,
                        local_3d0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        (ulong)(local_70.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,
                        (ulong)(local_410.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498.m_unit._M_dataplus._M_p != &local_498.m_unit.field_2) {
        operator_delete(local_498.m_unit._M_dataplus._M_p,
                        local_498.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498.m_desc._M_dataplus._M_p != &local_498.m_desc.field_2) {
        operator_delete(local_498.m_desc._M_dataplus._M_p,
                        local_498.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498.m_name._M_dataplus._M_p != &local_498.m_name.field_2) {
        operator_delete(local_498.m_name._M_dataplus._M_p,
                        local_498.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,
                        CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                                 local_120.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,
                        CONCAT17(local_100.field_2._M_local_buf[7],
                                 local_100.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_p != &local_2d8) {
        operator_delete(local_2e8._M_p,local_2d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_p != &local_2f8) {
        operator_delete(local_308._M_p,local_2f8._M_allocated_capacity + 1);
      }
      if (local_328 != (undefined1  [8])(auStack_320 + 8)) {
        operator_delete((void *)local_328,
                        CONCAT44(local_318._M_allocated_capacity._4_4_,
                                 local_318._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,
                        CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                 local_e0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,
                        (ulong)(local_348.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,
                        CONCAT17(local_3f0.field_2._M_local_buf[7],
                                 local_3f0.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((0.5 < fVar30) || (fVar30 < 0.1)) {
        local_328 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_320);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_320,"Wait time is",0xc);
        pcVar23 = " NOT";
        if (0.5 < fVar30) {
          pcVar23 = glcts::fixed_sample_locations_values + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_320,pcVar23,(ulong)(fVar30 <= 0.5) << 2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_320," correlated to rendering workload size.",0x27);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_328 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_320);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_320,
                   "Warning: Wait time correlation to rendering workload size is unclear.",0x45);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_320);
      std::ios_base::~ios_base(local_2b0);
      if ((0.5 < (float)local_4b8._0_4_) || ((float)local_4b8._0_4_ < 0.1)) {
        local_328 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_320);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_320,"Read time is",0xc);
        pcVar23 = " NOT";
        if (0.5 < (float)local_4b8._0_4_) {
          pcVar23 = glcts::fixed_sample_locations_values + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_320,pcVar23,(ulong)((float)local_4b8._0_4_ <= 0.5) << 2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_320," correlated to rendering workload size.",0x27);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_328 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_320);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_320,
                   "Warning: Read time correlation to rendering workload size is unclear.",0x45);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_320);
      std::ios_base::~ios_base(local_2b0);
      iVar13 = 0;
      bVar12 = true;
      do {
        bVar28 = iVar13 != 0;
        fVar29 = fVar30;
        if (bVar28) {
          fVar29 = (float)local_4b8._0_4_;
        }
        pcVar23 = "render and read";
        if (!bVar28) {
          pcVar23 = "Finish and wait";
        }
        EVar5 = (&this->m_waitBehavior)[(ulong)bVar28 * 2];
        fVar4 = (&this->m_waitThreshold)[(ulong)bVar28 * 2];
        if (EVar5 == EXPECT_COEF_GREATER_THAN) {
          bVar28 = fVar4 < fVar29;
        }
        else {
          bVar28 = fVar29 < fVar4 && EVar5 == EXPECT_COEF_LESS_THAN;
        }
        __s = "less than";
        if (EVar5 != EXPECT_COEF_LESS_THAN) {
          __s = (char *)0x0;
        }
        if (EVar5 == EXPECT_COEF_GREATER_THAN) {
          __s = "greater than";
        }
        if (!bVar28) {
          local_328 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_320);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_320,"ERROR: Expected ",0x10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_320,pcVar23 + 0xb,4)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_320," coefficient to be ",0x13);
          if (__s == (char *)0x0) {
            std::ios::clear((int)auStack_320 + (int)*(_func_int **)((long)auStack_320 + -0x18));
          }
          else {
            sVar20 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_320,__s,sVar20);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_320," ",1);
          std::ostream::_M_insert<double>((double)fVar4);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_320);
          std::ios_base::~ios_base(local_2b0);
          bVar12 = false;
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 == 1);
      pcVar23 = "Suspicious performance behavior";
      if (bVar12) {
        pcVar23 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~bVar12 & QP_TEST_RESULT_FAIL,pcVar23);
      if (local_c0.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.
                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c0.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c0.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_4d8.
          super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d8.
                        super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_4d8.
                              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_4d8.
                              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return STOP;
    }
  } while( true );
}

Assistant:

FlushFinishCase::IterateResult FlushFinishCase::iterate (void)
{
	vector<Sample>		samples		(NUM_SAMPLES);
	CalibrationParams	params;

	tcu::warmupCPU();

	setupRenderState();

	// Do one full render cycle.
	{
		render(1);
		readPixels();
	}

	// Calibrate.
	try
	{
		params = calibrate();
	}
	catch (const CalibrationFailedException& e)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, e.what());
		return STOP;
	}

	// Do measurement.
	{
		de::Random	rnd		(123);

		for (size_t ndx = 0; ndx < samples.size(); ndx++)
		{
			const int	drawCallCount	= rnd.getInt(1, params.maxDrawCalls);
			deUint64	waitStartTime;
			deUint64	readStartTime;
			deUint64	readFinishTime;

			render(drawCallCount);

			waitStartTime = deGetMicroseconds();
			waitForGL();

			readStartTime = deGetMicroseconds();
			readPixels();
			readFinishTime = deGetMicroseconds();

			samples[ndx].numDrawCalls	= drawCallCount;
			samples[ndx].waitTime		= readStartTime-waitStartTime;
			samples[ndx].readPixelsTime	= readFinishTime-readStartTime;

			if (m_testCtx.getWatchDog())
				qpWatchDog_touch(m_testCtx.getWatchDog());
		}
	}

	// Analyze - sets test case result.
	analyzeResults(samples, params);

	return STOP;
}